

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_memory.c
# Opt level: O0

SUNMemory SUNMemoryNewEmpty(void)

{
  SUNMemory mem;
  SUNMemory local_8;
  
  local_8 = (SUNMemory)malloc(0x10);
  if (local_8 == (SUNMemory)0x0) {
    local_8 = (SUNMemory)0x0;
  }
  return local_8;
}

Assistant:

SUNMemory SUNMemoryNewEmpty()
{
  SUNMemory mem = NULL;

  mem = (SUNMemory) malloc(sizeof(struct _SUNMemory));
  if (mem == NULL)
  {
    SUNDIALS_DEBUG_PRINT("ERROR in SUNMemoryNewEmpty: malloc failed\n");
    return(NULL);
  }

  return(mem);
}